

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_conn.c
# Opt level: O0

_Bool http_del_header_one(nni_list *hdrs,char *key)

{
  int iVar1;
  http_header *local_28;
  http_header *h;
  char *key_local;
  nni_list *hdrs_local;
  
  local_28 = (http_header *)nni_list_first(hdrs);
  while( true ) {
    if (local_28 == (http_header *)0x0) {
      return false;
    }
    iVar1 = nni_strcasecmp(key,local_28->name);
    if (iVar1 == 0) break;
    local_28 = (http_header *)nni_list_next(hdrs,local_28);
  }
  nni_http_free_header(local_28);
  return true;
}

Assistant:

static bool
http_del_header_one(nni_list *hdrs, const char *key)
{
	http_header *h;
	NNI_LIST_FOREACH (hdrs, h) {
		if (nni_strcasecmp(key, h->name) == 0) {
			nni_http_free_header(h);
			return (true);
		}
	}
	return (false);
}